

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Geometry3D.cpp
# Opt level: O0

void __thiscall Assimp::X3DImporter::ParseNode_Geometry3D_Extrusion(X3DImporter *this)

{
  pointer *this_00;
  pointer *ppvVar1;
  float fVar2;
  float fVar3;
  float _y;
  undefined4 uVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  pointer pFVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar10;
  size_type sVar11;
  reference pvVar12;
  reference pvVar13;
  reference pvVar14;
  DeadlyImportError *pDVar15;
  size_type sVar16;
  CX3DImporter_NodeElement_IndexedSet *pCVar17;
  aiVector3t<float> *paVar18;
  reference pvVar19;
  reference pvVar20;
  size_t sVar21;
  undefined1 pSpine_Closed;
  bool *pCurveIsClosed;
  aiVector3D aVar22;
  aiVector3t<float> aVar23;
  allocator local_521;
  string local_520;
  ulong local_500;
  size_t cri_e_1;
  size_t cri_2;
  size_t spi_e_2;
  size_t spi_2;
  int local_4d8;
  int local_4d4;
  int local_4d0;
  int local_4cc;
  int local_4c8;
  int local_4c4;
  int local_4c0;
  value_type_conflict1 local_4bc;
  int local_4b8;
  int local_4b4;
  int local_4b0;
  int local_4ac;
  int local_4a8;
  int local_4a4;
  int local_4a0;
  int local_49c;
  ulong local_498;
  size_t cri_1;
  size_t right_col;
  size_t cr_last;
  size_t cr_sz;
  size_t spi_e_1;
  size_t spi_1;
  ulong local_460;
  size_t i_e_4;
  size_t i_4;
  size_t beg;
  ulong local_440;
  size_t i_e_3;
  size_t i_3;
  float local_428;
  aiVector3t<float> local_420;
  aiVector3t<float> local_410;
  aiVector3t<float> local_400;
  aiVector3t<float> local_3f0;
  size_t local_3e4;
  float local_3dc;
  undefined8 local_3d8;
  float local_3d0;
  undefined8 local_3c8;
  float local_3c0;
  undefined1 local_3bc [8];
  aiVector3D tvecZ;
  aiVector3D tvecY;
  aiVector3D tvecX;
  size_t cri_e;
  size_t cri;
  aiVector3D tc23vec;
  size_t spi_e;
  size_t spi;
  undefined1 local_360 [8];
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tcross;
  aiMatrix4x4 scmat;
  aiVector3t<float> local_2e8;
  size_t local_2d8;
  float local_2d0;
  size_t local_2c8;
  float local_2c0;
  size_t local_2b8;
  float local_2b0;
  size_t local_2a8;
  float local_2a0;
  aiVector3t<float> local_298;
  aiVector3t<float> local_288;
  undefined1 local_278 [8];
  aiVector3D tvec;
  size_t i_e_2;
  size_t i_2;
  aiVector3D vecZ;
  float fStack_244;
  aiVector3D vecY;
  float fStack_234;
  aiVector3D vecX;
  aiMatrix4x4 rotmat;
  vector<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
  pointset_arr;
  vector<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_> basis_arr;
  bool cross_closed;
  bool spine_closed;
  CX3DImporter_NodeElement_IndexedSet *ext_alias;
  size_t i_e_1;
  size_t i_1;
  aiVector2D add_sc;
  size_t i_e;
  size_t i;
  float add_ori [4];
  size_t ori_size;
  string local_130;
  undefined4 local_110;
  allocator local_109;
  undefined1 local_108 [8];
  string an;
  uint local_d4;
  int idx_end;
  int idx;
  CX3DImporter_NodeElement *ne;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> spine;
  undefined1 local_a8 [7];
  bool solid;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> scale;
  vector<float,_std::allocator<float>_> orientation;
  undefined1 local_70 [7];
  bool endCap;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> crossSection;
  float creaseAngle;
  bool convex;
  bool ccw;
  bool beginCap;
  string def;
  string use;
  X3DImporter *this_local;
  
  std::__cxx11::string::string((string *)(def.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&creaseAngle);
  crossSection.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  crossSection.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  crossSection.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._5_1_ = 1;
  crossSection.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0.0;
  std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::vector
            ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)local_70);
  orientation.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = true;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &scale.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::vector
            ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)local_a8);
  spine.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&ne);
  _idx_end = (CX3DImporter_NodeElement_IndexedSet *)0x0;
  local_d4 = 0;
  pFVar9 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                     (&this->mReader);
  iVar6 = (*(pFVar9->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  for (; (int)local_d4 < iVar6; local_d4 = local_d4 + 1) {
    pFVar9 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    iVar7 = (*(pFVar9->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                      (pFVar9,(ulong)local_d4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_108,(char *)CONCAT44(extraout_var,iVar7),&local_109);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_108,"DEF");
    if (bVar5) {
      pFVar9 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                         (&this->mReader);
      iVar7 = (*(pFVar9->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                        (pFVar9,(ulong)local_d4);
      std::__cxx11::string::operator=
                ((string *)&creaseAngle,(char *)CONCAT44(extraout_var_00,iVar7));
      local_110 = 4;
    }
    else {
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_108,"USE");
      if (bVar5) {
        pFVar9 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                 operator->(&this->mReader);
        iVar7 = (*(pFVar9->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                          (pFVar9,(ulong)local_d4);
        std::__cxx11::string::operator=
                  ((string *)(def.field_2._M_local_buf + 8),(char *)CONCAT44(extraout_var_01,iVar7))
        ;
        local_110 = 4;
      }
      else {
        bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_108,"bboxCenter");
        if (bVar5) {
          local_110 = 4;
        }
        else {
          bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_108,"bboxSize");
          if (bVar5) {
            local_110 = 4;
          }
          else {
            bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_108,"containerField");
            if (bVar5) {
              local_110 = 4;
            }
            else {
              bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_108,"beginCap");
              if (bVar5) {
                crossSection.
                super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._7_1_ =
                     XML_ReadNode_GetAttrVal_AsBool(this,local_d4);
                local_110 = 4;
              }
              else {
                bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_108,"ccw");
                if (bVar5) {
                  crossSection.
                  super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage._6_1_ =
                       XML_ReadNode_GetAttrVal_AsBool(this,local_d4);
                  local_110 = 4;
                }
                else {
                  bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_108,"convex");
                  if (bVar5) {
                    crossSection.
                    super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ =
                         XML_ReadNode_GetAttrVal_AsBool(this,local_d4);
                    local_110 = 4;
                  }
                  else {
                    bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_108,"creaseAngle");
                    if (bVar5) {
                      crossSection.
                      super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
                           XML_ReadNode_GetAttrVal_AsFloat(this,local_d4);
                      local_110 = 4;
                    }
                    else {
                      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_108,"crossSection");
                      if (bVar5) {
                        XML_ReadNode_GetAttrVal_AsArrVec2f
                                  (this,local_d4,
                                   (vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *
                                   )local_70);
                        local_110 = 4;
                      }
                      else {
                        bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_108,"endCap");
                        if (bVar5) {
                          orientation.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage._7_1_ =
                               XML_ReadNode_GetAttrVal_AsBool(this,local_d4);
                          local_110 = 4;
                        }
                        else {
                          bVar5 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_108,"orientation");
                          if (bVar5) {
                            XML_ReadNode_GetAttrVal_AsArrF
                                      (this,local_d4,
                                       (vector<float,_std::allocator<float>_> *)
                                       &scale.
                                        super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
                            local_110 = 4;
                          }
                          else {
                            bVar5 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_108,"scale");
                            if (bVar5) {
                              XML_ReadNode_GetAttrVal_AsArrVec2f
                                        (this,local_d4,
                                         (vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                                          *)local_a8);
                              local_110 = 4;
                            }
                            else {
                              bVar5 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_108,"solid");
                              if (bVar5) {
                                spine.
                                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
                                     XML_ReadNode_GetAttrVal_AsBool(this,local_d4);
                                local_110 = 4;
                              }
                              else {
                                bVar5 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_108,"spine");
                                if (bVar5) {
                                  XML_ReadNode_GetAttrVal_AsArrVec3f
                                            (this,local_d4,
                                             (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                              *)&ne);
                                  local_110 = 4;
                                }
                                else {
                                  Throw_IncorrectAttr(this,(string *)local_108);
                                  local_110 = 0;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)local_108);
  }
  uVar10 = std::__cxx11::string::empty();
  if ((uVar10 & 1) == 0) {
    XML_CheckNode_MustBeEmpty(this);
    uVar10 = std::__cxx11::string::empty();
    if ((uVar10 & 1) == 0) {
      Throw_DEF_And_USE(this);
    }
    bVar5 = FindNodeElement(this,(string *)((long)&def.field_2 + 8),ENET_Extrusion,
                            (CX3DImporter_NodeElement **)&idx_end);
    if (!bVar5) {
      Throw_USE_NotFound(this,(string *)((long)&def.field_2 + 8));
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_Cur->Child,(value_type *)&idx_end);
  }
  else {
    sVar11 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                       ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&ne);
    if (sVar11 == 0) {
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&ne,2);
      pvVar12 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                          ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&ne,0);
      aiVector3t<float>::Set(pvVar12,0.0,0.0,0.0);
      pvVar12 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                          ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&ne,1);
      aiVector3t<float>::Set(pvVar12,0.0,1.0,0.0);
    }
    else {
      sVar11 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                         ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&ne);
      if (sVar11 == 1) {
        ori_size._6_1_ = 1;
        pDVar15 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_130,
                   "ParseNode_Geometry3D_Extrusion. Spine must have at least two points.",
                   (allocator *)((long)&ori_size + 7));
        DeadlyImportError::DeadlyImportError(pDVar15,&local_130);
        ori_size._6_1_ = 0;
        __cxa_throw(pDVar15,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
    }
    sVar11 = std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::size
                       ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)local_70);
    if (sVar11 == 0) {
      std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::resize
                ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)local_70,5);
      pvVar13 = std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::operator[]
                          ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)
                           local_70,0);
      aiVector2t<float>::Set(pvVar13,1.0,1.0);
      pvVar13 = std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::operator[]
                          ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)
                           local_70,1);
      aiVector2t<float>::Set(pvVar13,1.0,-1.0);
      pvVar13 = std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::operator[]
                          ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)
                           local_70,2);
      aiVector2t<float>::Set(pvVar13,-1.0,-1.0);
      pvVar13 = std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::operator[]
                          ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)
                           local_70,3);
      aiVector2t<float>::Set(pvVar13,-1.0,1.0);
      pvVar13 = std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::operator[]
                          ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)
                           local_70,4);
      aiVector2t<float>::Set(pvVar13,1.0,1.0);
    }
    sVar11 = std::vector<float,_std::allocator<float>_>::size
                       ((vector<float,_std::allocator<float>_> *)
                        &scale.
                         super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
    uVar10 = sVar11 >> 2;
    sVar11 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                       ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&ne);
    if (uVar10 < sVar11) {
      if (uVar10 == 1) {
        pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)
                             &scale.
                              super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
        i._0_4_ = *pvVar14;
        pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)
                             &scale.
                              super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,1);
        i._4_4_ = *pvVar14;
        pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)
                             &scale.
                              super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,2);
        add_ori[0] = *pvVar14;
        pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)
                             &scale.
                              super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,3);
        add_ori[1] = *pvVar14;
      }
      else {
        i._0_4_ = 0.0;
        i._4_4_ = 0.0;
        add_ori[0] = 1.0;
        add_ori[1] = 0.0;
      }
      sVar11 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                         ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&ne);
      std::vector<float,_std::allocator<float>_>::reserve
                ((vector<float,_std::allocator<float>_> *)
                 &scale.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,sVar11 << 2);
      i_e = 0;
      sVar11 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                         ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&ne);
      for (; i_e < sVar11 - uVar10; i_e = i_e + 1) {
        std::vector<float,_std::allocator<float>_>::push_back
                  ((vector<float,_std::allocator<float>_> *)
                   &scale.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type_conflict6 *)&i);
        std::vector<float,_std::allocator<float>_>::push_back
                  ((vector<float,_std::allocator<float>_> *)
                   &scale.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (value_type_conflict6 *)((long)&i + 4));
        std::vector<float,_std::allocator<float>_>::push_back
                  ((vector<float,_std::allocator<float>_> *)
                   &scale.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,add_ori);
        std::vector<float,_std::allocator<float>_>::push_back
                  ((vector<float,_std::allocator<float>_> *)
                   &scale.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,add_ori + 1);
      }
    }
    sVar11 = std::vector<float,_std::allocator<float>_>::size
                       ((vector<float,_std::allocator<float>_> *)
                        &scale.
                         super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((sVar11 & 3) != 0) {
      add_sc.x._2_1_ = 1;
      pDVar15 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&add_sc.y,
                 "Attribute \"orientation\" in <Extrusion> must has multiple four quantity of numbers."
                 ,(allocator *)((long)&add_sc.x + 3));
      DeadlyImportError::DeadlyImportError(pDVar15,(string *)&add_sc.y);
      add_sc.x._2_1_ = 0;
      __cxa_throw(pDVar15,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    sVar11 = std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::size
                       ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)local_a8);
    sVar16 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                       ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&ne);
    if (sVar11 < sVar16) {
      aiVector2t<float>::aiVector2t((aiVector2t<float> *)((long)&i_1 + 4));
      sVar11 = std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::size
                         ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)local_a8
                         );
      if (sVar11 == 1) {
        pvVar13 = std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::operator[]
                            ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)
                             local_a8,0);
        unique0x00012000 = *pvVar13;
      }
      else {
        aiVector2t<float>::Set((aiVector2t<float> *)((long)&i_1 + 4),1.0,1.0);
      }
      sVar11 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                         ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&ne);
      std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::reserve
                ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)local_a8,sVar11);
      i_e_1 = 0;
      sVar11 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                         ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&ne);
      sVar16 = std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::size
                         ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)local_a8
                         );
      for (; i_e_1 < sVar11 - sVar16; i_e_1 = i_e_1 + 1) {
        std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::push_back
                  ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)local_a8,
                   (value_type *)((long)&i_1 + 4));
      }
    }
    pCVar17 = (CX3DImporter_NodeElement_IndexedSet *)operator_new(0xf0);
    CX3DImporter_NodeElement_IndexedSet::CX3DImporter_NodeElement_IndexedSet
              (pCVar17,ENET_Extrusion,this->NodeElement_Cur);
    _idx_end = pCVar17;
    uVar10 = std::__cxx11::string::empty();
    if ((uVar10 & 1) == 0) {
      std::__cxx11::string::operator=
                ((string *)
                 &(_idx_end->super_CX3DImporter_NodeElement_Geometry3D).
                  super_CX3DImporter_NodeElement.ID,(string *)&creaseAngle);
    }
    pCVar17 = _idx_end;
    (_idx_end->super_CX3DImporter_NodeElement_Geometry3D).field_0x71 =
         crossSection.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1;
    _idx_end->Convex =
         (bool)(crossSection.
                super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._5_1_ & 1);
    _idx_end->CreaseAngle =
         crossSection.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_;
    (_idx_end->super_CX3DImporter_NodeElement_Geometry3D).Solid =
         (bool)(spine.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1);
    std::vector<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>::vector
              ((vector<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_> *)
               &pointset_arr.
                super__Vector_base<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
    ::vector((vector<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
              *)&rotmat.d3);
    GeometryHelper_Extrusion_CurveIsClosed<aiVector2t<float>>
              ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)local_70,true,true,
               (bool *)((long)&basis_arr.
                               super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
    pCurveIsClosed =
         (bool *)((long)&basis_arr.
                         super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    GeometryHelper_Extrusion_CurveIsClosed<aiVector3t<float>>
              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&ne,true,true,
               pCurveIsClosed);
    if ((basis_arr.super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
      pCurveIsClosed =
           (bool *)(ulong)orientation.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage._7_1_;
      crossSection.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
           (crossSection.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0 ||
           orientation.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._7_1_ != false;
      orientation.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._7_1_ = false;
    }
    aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)&vecX.z);
    aiVector3t<float>::aiVector3t((aiVector3t<float> *)&vecY.z,0.0);
    aiVector3t<float>::aiVector3t((aiVector3t<float> *)&vecZ.z,0.0);
    aiVector3t<float>::aiVector3t((aiVector3t<float> *)&i_2,0.0);
    sVar11 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                       ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&ne);
    std::vector<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>::resize
              ((vector<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_> *)
               &pointset_arr.
                super__Vector_base<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,sVar11);
    i_e_2 = 0;
    register0x00000000 =
         std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                   ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&ne);
    for (; pSpine_Closed = SUB81(pCurveIsClosed,0), i_e_2 < stack0xfffffffffffffd98;
        i_e_2 = i_e_2 + 1) {
      aiVector3t<float>::aiVector3t((aiVector3t<float> *)local_278);
      aVar22 = GeometryHelper_Extrusion_GetNextY
                         (i_e_2,(vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                                &ne,
                          (bool)(basis_arr.
                                 super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1));
      local_298.z = aVar22.z;
      local_298._0_8_ = aVar22._0_8_;
      local_2b0 = vecZ.x;
      local_2b8 = i_2;
      local_2c0 = vecZ.x;
      local_2c8 = i_2;
      aVar22.z = vecZ.x;
      aVar22.x = (float)(undefined4)i_2;
      aVar22.y = (float)i_2._4_4_;
      local_288._0_8_ = local_298._0_8_;
      local_288.z = local_298.z;
      unique0x10002991 = local_298._0_8_;
      vecY.x = local_298.z;
      aVar22 = GeometryHelper_Extrusion_GetNextZ
                         ((Assimp *)i_e_2,(size_t)&ne,
                          (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                          (ulong)(basis_arr.
                                  super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                          (bool)pSpine_Closed,aVar22);
      local_2d0 = aVar22.z;
      local_2d8 = aVar22._0_8_;
      local_2a8 = local_2d8;
      local_2a0 = local_2d0;
      i_2 = local_2d8;
      vecZ.x = local_2d0;
      aVar23 = operator^((aiVector3t<float> *)&vecZ.z,(aiVector3t<float> *)&i_2);
      local_2e8.z = aVar23.z;
      local_2e8._0_8_ = aVar23._0_8_;
      paVar18 = aiVector3t<float>::Normalize(&local_2e8);
      vecX.x = paVar18->z;
      pCurveIsClosed = (bool *)(ulong)(uint)vecX.x;
      vecY.z = paVar18->x;
      fStack_234 = paVar18->y;
      this_00 = &scale.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)this_00,i_e_2 * 4 + 3);
      fVar2 = *pvVar14;
      pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)this_00,i_e_2 << 2);
      fVar3 = *pvVar14;
      pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)this_00,i_e_2 * 4 + 1);
      _y = *pvVar14;
      pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)this_00,i_e_2 * 4 + 2);
      aiVector3t<float>::aiVector3t((aiVector3t<float> *)&scmat.d3,fVar3,_y,*pvVar14);
      aiMatrix4x4t<float>::Rotation
                (fVar2,(aiVector3t<float> *)&scmat.d3,(aiMatrix4x4t<float> *)&vecX.z);
      tvec.x = vecX.x;
      local_278._0_4_ = vecY.z;
      local_278._4_4_ = fStack_234;
      aiVector3t<float>::operator*=((aiVector3t<float> *)local_278,(aiMatrix4x4t<float> *)&vecX.z);
      uVar4 = local_278._0_4_;
      ppvVar1 = &pointset_arr.
                 super__Vector_base<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pvVar19 = std::vector<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>::operator[]
                          ((vector<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_> *)
                           ppvVar1,i_e_2);
      pvVar19->a1 = (float)uVar4;
      uVar4 = local_278._4_4_;
      pvVar19 = std::vector<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>::operator[]
                          ((vector<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_> *)
                           ppvVar1,i_e_2);
      fVar2 = tvec.x;
      pvVar19->a2 = (float)uVar4;
      pvVar19 = std::vector<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>::operator[]
                          ((vector<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_> *)
                           ppvVar1,i_e_2);
      pvVar19->a3 = fVar2;
      tvec.x = vecY.x;
      local_278._0_4_ = vecZ.z;
      local_278._4_4_ = fStack_244;
      aiVector3t<float>::operator*=((aiVector3t<float> *)local_278,(aiMatrix4x4t<float> *)&vecX.z);
      uVar4 = local_278._0_4_;
      ppvVar1 = &pointset_arr.
                 super__Vector_base<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pvVar19 = std::vector<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>::operator[]
                          ((vector<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_> *)
                           ppvVar1,i_e_2);
      pvVar19->b1 = (float)uVar4;
      uVar4 = local_278._4_4_;
      pvVar19 = std::vector<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>::operator[]
                          ((vector<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_> *)
                           ppvVar1,i_e_2);
      fVar2 = tvec.x;
      pvVar19->b2 = (float)uVar4;
      pvVar19 = std::vector<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>::operator[]
                          ((vector<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_> *)
                           ppvVar1,i_e_2);
      pvVar19->b3 = fVar2;
      tvec.x = vecZ.x;
      local_278 = (undefined1  [8])i_2;
      aiVector3t<float>::operator*=((aiVector3t<float> *)local_278,(aiMatrix4x4t<float> *)&vecX.z);
      uVar4 = local_278._0_4_;
      pvVar19 = std::vector<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>::operator[]
                          ((vector<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_> *)
                           &pointset_arr.
                            super__Vector_base<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,i_e_2);
      pvVar19->c1 = (float)uVar4;
      uVar4 = local_278._4_4_;
      pvVar19 = std::vector<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>::operator[]
                          ((vector<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_> *)
                           &pointset_arr.
                            super__Vector_base<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,i_e_2);
      fVar2 = tvec.x;
      pvVar19->c2 = (float)uVar4;
      pvVar19 = std::vector<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>::operator[]
                          ((vector<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_> *)
                           &pointset_arr.
                            super__Vector_base<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,i_e_2);
      pvVar19->c3 = fVar2;
    }
    aiMatrix4x4t<float>::aiMatrix4x4t
              ((aiMatrix4x4t<float> *)
               ((long)&tcross.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    sVar11 = std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::size
                       ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)local_70);
    std::allocator<aiVector3t<float>_>::allocator((allocator<aiVector3t<float>_> *)((long)&spi + 7))
    ;
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_360,sVar11,
               (allocator<aiVector3t<float>_> *)((long)&spi + 7));
    std::allocator<aiVector3t<float>_>::~allocator
              ((allocator<aiVector3t<float>_> *)((long)&spi + 7));
    sVar11 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                       ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&ne);
    std::
    vector<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
    ::resize((vector<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
              *)&rotmat.d3,sVar11);
    spi_e = 0;
    tc23vec._4_8_ =
         std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                   ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&ne);
    for (; spi_e < (ulong)tc23vec._4_8_; spi_e = spi_e + 1) {
      aiVector3t<float>::aiVector3t((aiVector3t<float> *)((long)&cri + 4));
      pvVar13 = std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::operator[]
                          ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)
                           local_a8,spi_e);
      fVar2 = pvVar13->x;
      pvVar13 = std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::operator[]
                          ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)
                           local_a8,spi_e);
      aiVector3t<float>::Set((aiVector3t<float> *)((long)&cri + 4),fVar2,0.0,pvVar13->y);
      aiMatrix4x4t<float>::Scaling
                ((aiVector3t<float> *)((long)&cri + 4),
                 (aiMatrix4x4t<float> *)
                 ((long)&tcross.
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      cri_e = 0;
      sVar11 = std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::size
                         ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)local_70
                         );
      for (; cri_e < sVar11; cri_e = cri_e + 1) {
        aiVector3t<float>::aiVector3t((aiVector3t<float> *)&tvecY.y);
        aiVector3t<float>::aiVector3t((aiVector3t<float> *)&tvecZ.y);
        aiVector3t<float>::aiVector3t((aiVector3t<float> *)local_3bc);
        pvVar13 = std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::operator[]
                            ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)
                             local_70,cri_e);
        fVar2 = pvVar13->x;
        pvVar13 = std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::operator[]
                            ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)
                             local_70,cri_e);
        aiVector3t<float>::Set((aiVector3t<float> *)((long)&cri + 4),fVar2,0.0,pvVar13->y);
        aVar23 = ::operator*((aiMatrix4x4t<float> *)
                             ((long)&tcross.
                                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                             (aiVector3t<float> *)((long)&cri + 4));
        local_3d0 = aVar23.z;
        local_3d8 = aVar23._0_8_;
        local_3c8 = local_3d8;
        local_3c0 = local_3d0;
        pvVar12 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                             local_360,cri_e);
        pvVar12->z = local_3c0;
        pvVar12->x = (float)(undefined4)local_3c8;
        pvVar12->y = (float)local_3c8._4_4_;
        ppvVar1 = &pointset_arr.
                   super__Vector_base<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pvVar19 = std::vector<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>::
                  operator[]((vector<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_> *)
                             ppvVar1,spi_e);
        fVar2 = pvVar19->a1;
        pvVar19 = std::vector<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>::
                  operator[]((vector<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_> *)
                             ppvVar1,spi_e);
        fVar3 = pvVar19->a2;
        pvVar19 = std::vector<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>::
                  operator[]((vector<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_> *)
                             ppvVar1,spi_e);
        aiVector3t<float>::Set((aiVector3t<float> *)&tvecY.y,fVar2,fVar3,pvVar19->a3);
        pvVar12 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                             local_360,cri_e);
        aiVector3t<float>::operator*=((aiVector3t<float> *)&tvecY.y,pvVar12->x);
        ppvVar1 = &pointset_arr.
                   super__Vector_base<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pvVar19 = std::vector<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>::
                  operator[]((vector<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_> *)
                             ppvVar1,spi_e);
        fVar2 = pvVar19->b1;
        pvVar19 = std::vector<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>::
                  operator[]((vector<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_> *)
                             ppvVar1,spi_e);
        fVar3 = pvVar19->b2;
        pvVar19 = std::vector<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>::
                  operator[]((vector<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_> *)
                             ppvVar1,spi_e);
        aiVector3t<float>::Set((aiVector3t<float> *)&tvecZ.y,fVar2,fVar3,pvVar19->b3);
        pvVar12 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                             local_360,cri_e);
        aiVector3t<float>::operator*=((aiVector3t<float> *)&tvecZ.y,pvVar12->y);
        ppvVar1 = &pointset_arr.
                   super__Vector_base<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pvVar19 = std::vector<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>::
                  operator[]((vector<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_> *)
                             ppvVar1,spi_e);
        fVar2 = pvVar19->c1;
        pvVar19 = std::vector<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>::
                  operator[]((vector<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_> *)
                             ppvVar1,spi_e);
        fVar3 = pvVar19->c2;
        pvVar19 = std::vector<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>::
                  operator[]((vector<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_> *)
                             ppvVar1,spi_e);
        aiVector3t<float>::Set((aiVector3t<float> *)local_3bc,fVar2,fVar3,pvVar19->c3);
        pvVar12 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                             local_360,cri_e);
        aiVector3t<float>::operator*=((aiVector3t<float> *)local_3bc,pvVar12->z);
        aVar23 = ::operator+((aiVector3t<float> *)&tvecY.y,(aiVector3t<float> *)&tvecZ.y);
        local_410.z = aVar23.z;
        local_410._0_8_ = aVar23._0_8_;
        local_400._0_8_ = local_410._0_8_;
        local_400.z = local_410.z;
        aVar23 = ::operator+(&local_400,(aiVector3t<float> *)local_3bc);
        local_420.z = aVar23.z;
        local_420._0_8_ = aVar23._0_8_;
        local_3f0._0_8_ = local_420._0_8_;
        local_3f0.z = local_420.z;
        pvVar12 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&ne,
                             spi_e);
        aVar23 = ::operator+(&local_3f0,pvVar12);
        local_428 = aVar23.z;
        i_3 = aVar23._0_8_;
        local_3e4 = i_3;
        local_3dc = local_428;
        pvVar12 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                             local_360,cri_e);
        pvVar12->x = (float)(undefined4)local_3e4;
        pvVar12->y = (float)local_3e4._4_4_;
        pvVar12->z = local_3dc;
      }
      pvVar20 = std::
                vector<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
                ::operator[]((vector<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
                              *)&rotmat.d3,spi_e);
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator=
                (pvVar20,(vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_360
                );
    }
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector
              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_360);
    if ((crossSection.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
      i_e_3 = 0;
      local_440 = std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::size
                            ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)
                             local_70);
      for (; i_e_3 < local_440; i_e_3 = i_e_3 + 1) {
        beg._4_4_ = (undefined4)i_e_3;
        std::vector<int,_std::allocator<int>_>::push_back
                  (&pCVar17->CoordIndex,(value_type_conflict1 *)((long)&beg + 4));
      }
      beg._0_4_ = 0xffffffff;
      std::vector<int,_std::allocator<int>_>::push_back
                (&pCVar17->CoordIndex,(value_type_conflict1 *)&beg);
    }
    if (orientation.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ != false) {
      sVar11 = std::
               vector<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
               ::size((vector<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
                       *)&rotmat.d3);
      sVar16 = std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::size
                         ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)local_70
                         );
      sVar21 = (sVar11 - 1) * sVar16;
      i_e_4 = sVar21;
      i_4 = sVar21;
      sVar11 = std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::size
                         ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)local_70
                         );
      local_460 = sVar21 + sVar11;
      for (; i_e_4 < local_460; i_e_4 = i_e_4 + 1) {
        spi_1._4_4_ = (undefined4)i_e_4;
        std::vector<int,_std::allocator<int>_>::push_back
                  (&pCVar17->CoordIndex,(value_type_conflict1 *)((long)&spi_1 + 4));
      }
      spi_1._0_4_ = 0xffffffff;
      std::vector<int,_std::allocator<int>_>::push_back
                (&pCVar17->CoordIndex,(value_type_conflict1 *)&spi_1);
    }
    spi_e_1 = 0;
    sVar11 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                       ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&ne);
    cr_sz = sVar11 - 1;
    for (; spi_e_1 <= cr_sz; spi_e_1 = spi_e_1 + 1) {
      cr_last = std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::size
                          ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)
                           local_70);
      sVar11 = std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::size
                         ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)local_70
                         );
      right_col = sVar11 - 1;
      if (spi_e_1 == cr_sz) {
        if ((basis_arr.
             super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) break;
        cri_1 = 0;
      }
      else {
        cri_1 = spi_e_1 + 1;
      }
      for (local_498 = 0; local_498 < cr_last; local_498 = local_498 + 1) {
        if (local_498 == right_col) {
          if ((basis_arr.
               super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1) != 0) {
            if ((crossSection.
                 super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._6_1_ & 1) == 0) {
              local_4d0 = (int)spi_e_1 * (int)cr_last;
              std::vector<int,_std::allocator<int>_>::push_back(&pCVar17->CoordIndex,&local_4d0);
              local_4d4 = (int)cri_1 * (int)cr_last;
              std::vector<int,_std::allocator<int>_>::push_back(&pCVar17->CoordIndex,&local_4d4);
              local_4d8 = (int)cri_1 * (int)cr_last + (int)local_498;
              std::vector<int,_std::allocator<int>_>::push_back(&pCVar17->CoordIndex,&local_4d8);
              spi_2._4_4_ = (int)spi_e_1 * (int)cr_last + (int)local_498;
              std::vector<int,_std::allocator<int>_>::push_back
                        (&pCVar17->CoordIndex,(value_type_conflict1 *)((long)&spi_2 + 4));
            }
            else {
              local_4c0 = (int)spi_e_1 * (int)cr_last + (int)local_498;
              std::vector<int,_std::allocator<int>_>::push_back(&pCVar17->CoordIndex,&local_4c0);
              local_4c4 = (int)cri_1 * (int)cr_last + (int)local_498;
              std::vector<int,_std::allocator<int>_>::push_back(&pCVar17->CoordIndex,&local_4c4);
              local_4c8 = (int)cri_1 * (int)cr_last;
              std::vector<int,_std::allocator<int>_>::push_back(&pCVar17->CoordIndex,&local_4c8);
              local_4cc = (int)spi_e_1 * (int)cr_last;
              std::vector<int,_std::allocator<int>_>::push_back(&pCVar17->CoordIndex,&local_4cc);
            }
            spi_2._0_4_ = 0xffffffff;
            std::vector<int,_std::allocator<int>_>::push_back
                      (&pCVar17->CoordIndex,(value_type_conflict1 *)&spi_2);
          }
        }
        else {
          if ((crossSection.
               super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._6_1_ & 1) == 0) {
            local_4ac = (int)spi_e_1 * (int)cr_last + 1 + (int)local_498;
            std::vector<int,_std::allocator<int>_>::push_back(&pCVar17->CoordIndex,&local_4ac);
            local_4b0 = (int)cri_1 * (int)cr_last + 1 + (int)local_498;
            std::vector<int,_std::allocator<int>_>::push_back(&pCVar17->CoordIndex,&local_4b0);
            local_4b4 = (int)cri_1 * (int)cr_last + (int)local_498;
            std::vector<int,_std::allocator<int>_>::push_back(&pCVar17->CoordIndex,&local_4b4);
            local_4b8 = (int)spi_e_1 * (int)cr_last + (int)local_498;
            std::vector<int,_std::allocator<int>_>::push_back(&pCVar17->CoordIndex,&local_4b8);
          }
          else {
            local_49c = (int)spi_e_1 * (int)cr_last + (int)local_498;
            std::vector<int,_std::allocator<int>_>::push_back(&pCVar17->CoordIndex,&local_49c);
            local_4a0 = (int)cri_1 * (int)cr_last + (int)local_498;
            std::vector<int,_std::allocator<int>_>::push_back(&pCVar17->CoordIndex,&local_4a0);
            local_4a4 = (int)cri_1 * (int)cr_last + 1 + (int)local_498;
            std::vector<int,_std::allocator<int>_>::push_back(&pCVar17->CoordIndex,&local_4a4);
            local_4a8 = (int)spi_e_1 * (int)cr_last + 1 + (int)local_498;
            std::vector<int,_std::allocator<int>_>::push_back(&pCVar17->CoordIndex,&local_4a8);
          }
          local_4bc = -1;
          std::vector<int,_std::allocator<int>_>::push_back(&pCVar17->CoordIndex,&local_4bc);
        }
      }
    }
    spi_e_2 = 0;
    cri_2 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                      ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&ne);
    for (; spi_e_2 < cri_2; spi_e_2 = spi_e_2 + 1) {
      cri_e_1 = 0;
      local_500 = std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::size
                            ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)
                             local_70);
      for (; cri_e_1 < local_500; cri_e_1 = cri_e_1 + 1) {
        pvVar20 = std::
                  vector<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
                  ::operator[]((vector<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
                                *)&rotmat.d3,spi_e_2);
        pvVar12 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                            (pvVar20,cri_e_1);
        std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                  (&(pCVar17->super_CX3DImporter_NodeElement_Geometry3D).Vertices,pvVar12);
      }
    }
    pFVar9 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    uVar8 = (*(pFVar9->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    pCVar17 = _idx_end;
    if ((uVar8 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_520,"Extrusion",&local_521);
      ParseNode_Metadata(this,(CX3DImporter_NodeElement *)pCVar17,&local_520);
      std::__cxx11::string::~string((string *)&local_520);
      std::allocator<char>::~allocator((allocator<char> *)&local_521);
    }
    else {
      std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
      push_back(&this->NodeElement_Cur->Child,(value_type *)&idx_end);
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_List,(value_type *)&idx_end);
    std::
    vector<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
    ::~vector((vector<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
               *)&rotmat.d3);
    std::vector<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>::~vector
              ((vector<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_> *)
               &pointset_arr.
                super__Vector_base<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&ne);
  std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::~vector
            ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)local_a8);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             &scale.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::~vector
            ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)local_70);
  std::__cxx11::string::~string((string *)&creaseAngle);
  std::__cxx11::string::~string((string *)(def.field_2._M_local_buf + 8));
  return;
}

Assistant:

void X3DImporter::ParseNode_Geometry3D_Extrusion()
{
    std::string use, def;
    bool beginCap = true;
    bool ccw = true;
    bool convex = true;
    float creaseAngle = 0;
    std::vector<aiVector2D> crossSection;
    bool endCap = true;
    std::vector<float> orientation;
    std::vector<aiVector2D> scale;
    bool solid = true;
    std::vector<aiVector3D> spine;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("beginCap", beginCap, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("ccw", ccw, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("convex", convex, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("creaseAngle", creaseAngle, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_REF("crossSection", crossSection, XML_ReadNode_GetAttrVal_AsArrVec2f);
		MACRO_ATTRREAD_CHECK_RET("endCap", endCap, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_REF("orientation", orientation, XML_ReadNode_GetAttrVal_AsArrF);
		MACRO_ATTRREAD_CHECK_REF("scale", scale, XML_ReadNode_GetAttrVal_AsArrVec2f);
		MACRO_ATTRREAD_CHECK_RET("solid", solid, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_REF("spine", spine, XML_ReadNode_GetAttrVal_AsArrVec3f);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_Extrusion, ne);
	}
	else
	{
		//
		// check if default values must be assigned
		//
		if(spine.size() == 0)
		{
			spine.resize(2);
			spine[0].Set(0, 0, 0), spine[1].Set(0, 1, 0);
		}
		else if(spine.size() == 1)
		{
			throw DeadlyImportError("ParseNode_Geometry3D_Extrusion. Spine must have at least two points.");
		}

		if(crossSection.size() == 0)
		{
			crossSection.resize(5);
			crossSection[0].Set(1, 1), crossSection[1].Set(1, -1), crossSection[2].Set(-1, -1), crossSection[3].Set(-1, 1), crossSection[4].Set(1, 1);
		}

		{// orientation
			size_t ori_size = orientation.size() / 4;

			if(ori_size < spine.size())
			{
				float add_ori[4];// values that will be added

				if(ori_size == 1)// if "orientation" has one element(means one MFRotation with four components) then use it value for all spine points.
				{
					add_ori[0] = orientation[0], add_ori[1] = orientation[1], add_ori[2] = orientation[2], add_ori[3] = orientation[3];
				}
				else// else - use default values
				{
					add_ori[0] = 0, add_ori[1] = 0, add_ori[2] = 1, add_ori[3] = 0;
				}

				orientation.reserve(spine.size() * 4);
				for(size_t i = 0, i_e = (spine.size() - ori_size); i < i_e; i++)
					orientation.push_back(add_ori[0]), orientation.push_back(add_ori[1]), orientation.push_back(add_ori[2]), orientation.push_back(add_ori[3]);
			}

			if(orientation.size() % 4) throw DeadlyImportError("Attribute \"orientation\" in <Extrusion> must has multiple four quantity of numbers.");
		}// END: orientation

		{// scale
			if(scale.size() < spine.size())
			{
				aiVector2D add_sc;

				if(scale.size() == 1)// if "scale" has one element then use it value for all spine points.
					add_sc = scale[0];
				else// else - use default values
					add_sc.Set(1, 1);

				scale.reserve(spine.size());
				for(size_t i = 0, i_e = (spine.size() - scale.size()); i < i_e; i++) scale.push_back(add_sc);
			}
		}// END: scale
		//
		// create and if needed - define new geometry object.
		//
		ne = new CX3DImporter_NodeElement_IndexedSet(CX3DImporter_NodeElement::ENET_Extrusion, NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		CX3DImporter_NodeElement_IndexedSet& ext_alias = *((CX3DImporter_NodeElement_IndexedSet*)ne);// create alias for conveience
		// assign part of input data
		ext_alias.CCW = ccw;
		ext_alias.Convex = convex;
		ext_alias.CreaseAngle = creaseAngle;
		ext_alias.Solid = solid;

		//
		// How we done it at all?
		// 1. At first we will calculate array of basises for every point in spine(look SCP in ISO-dic). Also "orientation" vector
		// are applied vor every basis.
		// 2. After that we can create array of point sets: which are scaled, transferred to basis of relative basis and at final translated to real position
		// using relative spine point.
		// 3. Next step is creating CoordIdx array(do not forget "-1" delimiter). While creating CoordIdx also created faces for begin and end caps, if
		// needed. While createing CootdIdx is taking in account CCW flag.
		// 4. The last step: create Vertices list.
		//
        bool spine_closed;// flag: true if spine curve is closed.
        bool cross_closed;// flag: true if cross curve is closed.
        std::vector<aiMatrix3x3> basis_arr;// array of basises. ROW_a - X, ROW_b - Y, ROW_c - Z.
        std::vector<std::vector<aiVector3D> > pointset_arr;// array of point sets: cross curves.

        // detect closed curves
        GeometryHelper_Extrusion_CurveIsClosed(crossSection, true, true, cross_closed);// true - drop tail, true - remove duplicate end.
        GeometryHelper_Extrusion_CurveIsClosed(spine, true, true, spine_closed);// true - drop tail, true - remove duplicate end.
        // If both cap are requested and spine curve is closed then we can make only one cap. Because second cap will be the same surface.
        if(spine_closed)
        {
			beginCap |= endCap;
			endCap = false;
		}

        {// 1. Calculate array of basises.
			aiMatrix4x4 rotmat;
			aiVector3D vecX(0), vecY(0), vecZ(0);

			basis_arr.resize(spine.size());
			for(size_t i = 0, i_e = spine.size(); i < i_e; i++)
			{
				aiVector3D tvec;

				// get axises of basis.
				vecY = GeometryHelper_Extrusion_GetNextY(i, spine, spine_closed);
				vecZ = GeometryHelper_Extrusion_GetNextZ(i, spine, spine_closed, vecZ);
				vecX = (vecY ^ vecZ).Normalize();
				// get rotation matrix and apply "orientation" to basis
				aiMatrix4x4::Rotation(orientation[i * 4 + 3], aiVector3D(orientation[i * 4], orientation[i * 4 + 1], orientation[i * 4 + 2]), rotmat);
				tvec = vecX, tvec *= rotmat, basis_arr[i].a1 = tvec.x, basis_arr[i].a2 = tvec.y, basis_arr[i].a3 = tvec.z;
				tvec = vecY, tvec *= rotmat, basis_arr[i].b1 = tvec.x, basis_arr[i].b2 = tvec.y, basis_arr[i].b3 = tvec.z;
				tvec = vecZ, tvec *= rotmat, basis_arr[i].c1 = tvec.x, basis_arr[i].c2 = tvec.y, basis_arr[i].c3 = tvec.z;
			}// for(size_t i = 0, i_e = spine.size(); i < i_e; i++)
		}// END: 1. Calculate array of basises

		{// 2. Create array of point sets.
			aiMatrix4x4 scmat;
			std::vector<aiVector3D> tcross(crossSection.size());

			pointset_arr.resize(spine.size());
			for(size_t spi = 0, spi_e = spine.size(); spi < spi_e; spi++)
			{
				aiVector3D tc23vec;

				tc23vec.Set(scale[spi].x, 0, scale[spi].y);
				aiMatrix4x4::Scaling(tc23vec, scmat);
				for(size_t cri = 0, cri_e = crossSection.size(); cri < cri_e; cri++)
				{
					aiVector3D tvecX, tvecY, tvecZ;

					tc23vec.Set(crossSection[cri].x, 0, crossSection[cri].y);
					// apply scaling to point
					tcross[cri] = scmat * tc23vec;
					//
					// transfer point to new basis
					// calculate coordinate in new basis
					tvecX.Set(basis_arr[spi].a1, basis_arr[spi].a2, basis_arr[spi].a3), tvecX *= tcross[cri].x;
					tvecY.Set(basis_arr[spi].b1, basis_arr[spi].b2, basis_arr[spi].b3), tvecY *= tcross[cri].y;
					tvecZ.Set(basis_arr[spi].c1, basis_arr[spi].c2, basis_arr[spi].c3), tvecZ *= tcross[cri].z;
					// apply new coordinates and translate it to spine point.
					tcross[cri] = tvecX + tvecY + tvecZ + spine[spi];
				}// for(size_t cri = 0, cri_e = crossSection.size(); cri < cri_e; i++)

				pointset_arr[spi] = tcross;// store transferred point set
			}// for(size_t spi = 0, spi_e = spine.size(); spi < spi_e; i++)
		}// END: 2. Create array of point sets.

		{// 3. Create CoordIdx.
			// add caps if needed
			if(beginCap)
			{
				// add cap as polygon. vertices of cap are places at begin, so just add numbers from zero.
				for(size_t i = 0, i_e = crossSection.size(); i < i_e; i++) ext_alias.CoordIndex.push_back(static_cast<int32_t>(i));

				// add delimiter
				ext_alias.CoordIndex.push_back(-1);
			}// if(beginCap)

			if(endCap)
			{
				// add cap as polygon. vertices of cap are places at end, as for beginCap use just sequence of numbers but with offset.
				size_t beg = (pointset_arr.size() - 1) * crossSection.size();

				for(size_t i = beg, i_e = (beg + crossSection.size()); i < i_e; i++) ext_alias.CoordIndex.push_back(static_cast<int32_t>(i));

				// add delimiter
				ext_alias.CoordIndex.push_back(-1);
			}// if(beginCap)

			// add quads
			for(size_t spi = 0, spi_e = (spine.size() - 1); spi <= spi_e; spi++)
			{
				const size_t cr_sz = crossSection.size();
				const size_t cr_last = crossSection.size() - 1;

				size_t right_col;// hold index basis for points of quad placed in right column;

				if(spi != spi_e)
					right_col = spi + 1;
				else if(spine_closed)// if spine curve is closed then one more quad is needed: between first and last points of curve.
					right_col = 0;
				else
					break;// if spine curve is not closed then break the loop, because spi is out of range for that type of spine.

				for(size_t cri = 0; cri < cr_sz; cri++)
				{
					if(cri != cr_last)
					{
						MACRO_FACE_ADD_QUAD(ccw, ext_alias.CoordIndex,
											static_cast<int32_t>(spi * cr_sz + cri), 
                                            static_cast<int32_t>(right_col * cr_sz + cri), 
                                            static_cast<int32_t>(right_col * cr_sz + cri + 1), 
                                            static_cast<int32_t>(spi * cr_sz + cri + 1));
						// add delimiter
						ext_alias.CoordIndex.push_back(-1);
					}
					else if(cross_closed)// if cross curve is closed then one more quad is needed: between first and last points of curve.
					{
						MACRO_FACE_ADD_QUAD(ccw, ext_alias.CoordIndex,
                                            static_cast<int32_t>(spi * cr_sz + cri), 
                                            static_cast<int32_t>(right_col * cr_sz + cri), 
                                            static_cast<int32_t>(right_col * cr_sz + 0), 
                                            static_cast<int32_t>(spi * cr_sz + 0));
						// add delimiter
						ext_alias.CoordIndex.push_back(-1);
					}
				}// for(size_t cri = 0; cri < cr_sz; cri++)
			}// for(size_t spi = 0, spi_e = (spine.size() - 2); spi < spi_e; spi++)
		}// END: 3. Create CoordIdx.

		{// 4. Create vertices list.
			// just copy all vertices
			for(size_t spi = 0, spi_e = spine.size(); spi < spi_e; spi++)
			{
				for(size_t cri = 0, cri_e = crossSection.size(); cri < cri_e; cri++)
				{
					ext_alias.Vertices.push_back(pointset_arr[spi][cri]);
				}
			}
		}// END: 4. Create vertices list.
//PrintVectorSet("Ext. CoordIdx", ext_alias.CoordIndex);
//PrintVectorSet("Ext. Vertices", ext_alias.Vertices);
		// check for child nodes
		if(!mReader->isEmptyElement())
			ParseNode_Metadata(ne, "Extrusion");
		else
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}